

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::
ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::VarHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3> *this)

{
  int iVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  iVar1 = TextReader<fmt::Locale>::ReadUInt<int>(*(TextReader<fmt::Locale> **)this);
  if (**(int **)(this + 8) < iVar1) {
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    local_20.field_1.values_ = (Value *)&local_38;
    TextReader<fmt::Locale>::DoReportError
              (*(TextReader<fmt::Locale> **)this,
               ((*(TextReader<fmt::Locale> **)this)->super_ReaderBase).token_,(CStringRef)0x2678fe,
               &local_20);
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  if (0 < iVar1) {
    do {
      NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadUInt
                ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *)this,
                 **(uint **)(this + 8));
      TextReader<fmt::Locale>::ReadDouble(*(TextReader<fmt::Locale> **)this);
      TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadInitialValues() {
  int num_values = reader_.ReadUInt();
  ValueHandler vh(*this);
  if (num_values > vh.num_items())
    reader_.ReportError("too many initial values");
  reader_.ReadTillEndOfLine();
  for (int i = 0; i < num_values; ++i) {
    int index = ReadUInt(vh.num_items());
    vh.SetInitialValue(index, reader_.ReadDouble());
    reader_.ReadTillEndOfLine();
  }
}